

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void P_CheckPlayerSprite(AActor *actor,int *spritenum,DVector2 *scale)

{
  double dVar1;
  player_t *ppVar2;
  BYTE *pBVar3;
  FPlayerSkin *pFVar4;
  int iVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined4 extraout_var;
  int *piVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  
  ppVar2 = actor->player;
  puVar9 = (undefined8 *)
           ((long)&((ppVar2->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Nodes)->Next +
           (ulong)(((ppVar2->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                    Size - 1 & 0x208) * 0x18));
  do {
    puVar7 = puVar9;
    puVar9 = (undefined8 *)*puVar7;
  } while (*(int *)(puVar7 + 1) != 0x208);
  if ((*(int *)(puVar7[2] + 0x28) != 0) && (((actor->flags4).Value & 0x20) == 0)) {
    if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar5 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
      (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
    }
    pFVar4 = skins;
    pBVar3 = ((actor->super_DThinker).super_DObject.Class)->Defaults;
    dVar1 = *(double *)(pBVar3 + 0x100);
    puVar9 = (undefined8 *)
             ((long)&((ppVar2->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((ppVar2->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x208) * 0x18));
    puVar7 = puVar9;
    do {
      puVar10 = puVar7;
      puVar7 = (undefined8 *)*puVar10;
    } while (*(int *)(puVar10 + 1) != 0x208);
    scale->X = (skins[*(int *)(puVar10[2] + 0x28)].Scale.X / *(double *)(pBVar3 + 0xf8)) * scale->X;
    do {
      puVar7 = puVar9;
      puVar9 = (undefined8 *)*puVar7;
    } while (*(int *)(puVar7 + 1) != 0x208);
    scale->Y = (pFVar4[*(int *)(puVar7[2] + 0x28)].Scale.Y / dVar1) * scale->Y;
  }
  if (0.75 < ppVar2->crouchfactor || ppVar2->crouchfactor == 0.75) {
    return;
  }
  iVar5 = *spritenum;
  if ((iVar5 == actor->SpawnState->sprite) ||
     (iVar5 == *(int *)&(ppVar2->mo->super_AActor).field_0x4bc)) {
    piVar8 = (int *)&(ppVar2->mo->super_AActor).field_0x4bc;
  }
  else {
    iVar6 = -1;
    if (((actor->flags4).Value & 0x20) != 0) goto LAB_0046a2b4;
    puVar9 = (undefined8 *)
             ((long)&((ppVar2->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((ppVar2->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x208) * 0x18));
    puVar7 = puVar9;
    do {
      puVar10 = puVar7;
      puVar7 = (undefined8 *)*puVar10;
    } while (*(int *)(puVar10 + 1) != 0x208);
    puVar7 = puVar9;
    if (iVar5 != skins[*(int *)(puVar10[2] + 0x28)].sprite) {
      do {
        puVar10 = puVar7;
        puVar7 = (undefined8 *)*puVar10;
      } while (*(int *)(puVar10 + 1) != 0x208);
      if (iVar5 != skins[*(int *)(puVar10[2] + 0x28)].crouchsprite) goto LAB_0046a2b4;
    }
    do {
      puVar7 = puVar9;
      puVar9 = (undefined8 *)*puVar7;
    } while (*(int *)(puVar7 + 1) != 0x208);
    piVar8 = &skins[*(int *)(puVar7[2] + 0x28)].crouchsprite;
  }
  iVar6 = *piVar8;
LAB_0046a2b4:
  if (iVar6 < 1) {
    if (ppVar2->playerstate != '\x01') {
      scale->Y = scale->Y * 0.5;
    }
  }
  else {
    *spritenum = iVar6;
  }
  return;
}

Assistant:

void P_CheckPlayerSprite(AActor *actor, int &spritenum, DVector2 &scale)
{
	player_t *player = actor->player;
	int crouchspriteno;

	if (player->userinfo.GetSkin() != 0 && !(actor->flags4 & MF4_NOSKIN))
	{
		// Convert from default scale to skin scale.
		DVector2 defscale = actor->GetDefault()->Scale;
		scale.X *= skins[player->userinfo.GetSkin()].Scale.X / defscale.X;
		scale.Y *= skins[player->userinfo.GetSkin()].Scale.Y / defscale.Y;
	}

	// Set the crouch sprite?
	if (player->crouchfactor < 0.75)
	{
		if (spritenum == actor->SpawnState->sprite || spritenum == player->mo->crouchsprite) 
		{
			crouchspriteno = player->mo->crouchsprite;
		}
		else if (!(actor->flags4 & MF4_NOSKIN) &&
				(spritenum == skins[player->userinfo.GetSkin()].sprite ||
				 spritenum == skins[player->userinfo.GetSkin()].crouchsprite))
		{
			crouchspriteno = skins[player->userinfo.GetSkin()].crouchsprite;
		}
		else
		{ // no sprite -> squash the existing one
			crouchspriteno = -1;
		}

		if (crouchspriteno > 0) 
		{
			spritenum = crouchspriteno;
		}
		else if (player->playerstate != PST_DEAD && player->crouchfactor < 0.75)
		{
			scale.Y *= 0.5;
		}
	}
}